

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

statement_ptr __thiscall
mjs::parser::
make_statement<mjs::expression_statement,std::unique_ptr<mjs::expression,std::default_delete<mjs::expression>>>
          (parser *this,unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_> *args)

{
  expression_statement *this_00;
  expression_ptr *in_RDX;
  source_extend local_40;
  undefined1 local_21;
  expression_ptr *local_20;
  unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_> *args_local;
  parser *this_local;
  statement_ptr *s;
  
  args_local = args;
  this_local = this;
  if (args[0xe]._M_t.super___uniq_ptr_impl<mjs::expression,_std::default_delete<mjs::expression>_>.
      _M_t.super__Tuple_impl<0UL,_mjs::expression_*,_std::default_delete<mjs::expression>_>.
      super__Head_base<0UL,_mjs::expression_*,_false>._M_head_impl == (expression *)0x0) {
    __assert_fail("statement_pos_",
                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/parser.cpp"
                  ,0x147,
                  "statement_ptr mjs::parser::make_statement(Args &&...) [T = mjs::expression_statement, Args = <std::unique_ptr<mjs::expression>>]"
                 );
  }
  local_21 = 0;
  local_20 = in_RDX;
  this_00 = (expression_statement *)operator_new(0x28);
  position_stack_node::extend
            (&local_40,
             (position_stack_node *)
             args[0xe]._M_t.
             super___uniq_ptr_impl<mjs::expression,_std::default_delete<mjs::expression>_>._M_t.
             super__Tuple_impl<0UL,_mjs::expression_*,_std::default_delete<mjs::expression>_>.
             super__Head_base<0UL,_mjs::expression_*,_false>._M_head_impl);
  expression_statement::expression_statement(this_00,&local_40,local_20);
  std::unique_ptr<mjs::statement,std::default_delete<mjs::statement>>::
  unique_ptr<std::default_delete<mjs::statement>,void>
            ((unique_ptr<mjs::statement,std::default_delete<mjs::statement>> *)this,(pointer)this_00
            );
  source_extend::~source_extend(&local_40);
  return (__uniq_ptr_data<mjs::statement,_std::default_delete<mjs::statement>,_true,_true>)
         (__uniq_ptr_data<mjs::statement,_std::default_delete<mjs::statement>,_true,_true>)this;
}

Assistant:

statement_ptr make_statement(Args&&... args) {
        assert(statement_pos_);
        auto s = statement_ptr{new T{statement_pos_->extend(), std::forward<Args>(args)...}};
#ifdef PARSER_DEBUG
        std::wcout << s->extend() << " Producting: " << *s << "\n";
#endif
        return s;
    }